

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O1

REF_STATUS ref_adj_node_inspect(REF_ADJ ref_adj,REF_INT node)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  printf(" %d :");
  uVar3 = 0xffffffff;
  if ((-1 < node) && (uVar3 = 0xffffffff, node < ref_adj->nnode)) {
    uVar3 = (ulong)(uint)ref_adj->first[(uint)node];
  }
  if ((int)uVar3 != -1) {
    uVar2 = (ulong)(uint)ref_adj->item[(int)uVar3].ref;
    do {
      printf(" %d",uVar2);
      iVar1 = ref_adj->item[(int)uVar3].next;
      uVar3 = (ulong)iVar1;
      if (uVar3 == 0xffffffffffffffff) {
        uVar2 = 0xffffffff;
      }
      else {
        uVar2 = (ulong)(uint)ref_adj->item[uVar3].ref;
      }
    } while (iVar1 != -1);
  }
  putchar(10);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_adj_node_inspect(REF_ADJ ref_adj, REF_INT node) {
  REF_INT item, ref;
  printf(" %d :", node);
  each_ref_adj_node_item_with_ref(ref_adj, node, item, ref) {
    printf(" %d", ref);
  }
  printf("\n");

  return REF_SUCCESS;
}